

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlParserCtxtPtr
xmlCreateIOParserCtxt
          (xmlSAXHandlerPtr sax,void *user_data,xmlInputReadCallback ioread,
          xmlInputCloseCallback ioclose,void *ioctx,xmlCharEncoding enc)

{
  int iVar1;
  xmlParserCtxtPtr ctxt;
  char *encoding;
  xmlParserInputPtr value;
  
  ctxt = xmlNewSAXParserCtxt(sax,user_data);
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    encoding = xmlGetCharEncodingName(enc);
    value = xmlCtxtNewInputFromIO(ctxt,(char *)0x0,ioread,ioclose,ioctx,encoding,0);
    if (value != (xmlParserInputPtr)0x0) {
      iVar1 = xmlCtxtPushInput(ctxt,value);
      if (-1 < iVar1) {
        return ctxt;
      }
      xmlFreeInputStream(value);
    }
    xmlFreeParserCtxt(ctxt);
  }
  return (xmlParserCtxtPtr)0x0;
}

Assistant:

xmlParserCtxtPtr
xmlCreateIOParserCtxt(xmlSAXHandlerPtr sax, void *user_data,
                      xmlInputReadCallback ioread,
                      xmlInputCloseCallback ioclose,
                      void *ioctx, xmlCharEncoding enc) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;
    const char *encoding;

    ctxt = xmlNewSAXParserCtxt(sax, user_data);
    if (ctxt == NULL)
	return(NULL);

    encoding = xmlGetCharEncodingName(enc);
    input = xmlCtxtNewInputFromIO(ctxt, NULL, ioread, ioclose, ioctx,
                                  encoding, 0);
    if (input == NULL) {
	xmlFreeParserCtxt(ctxt);
        return (NULL);
    }
    if (xmlCtxtPushInput(ctxt, input) < 0) {
        xmlFreeInputStream(input);
        xmlFreeParserCtxt(ctxt);
        return(NULL);
    }

    return(ctxt);
}